

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CovergroupType::inheritMembers
          (CovergroupType *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  string_view arg;
  SourceRange sourceRange;
  bool bVar1;
  SyntaxNode *this_00;
  Scope *pSVar2;
  Compilation *this_01;
  Type *pTVar3;
  SourceLocation SVar4;
  Symbol *pSVar5;
  TransparentMemberSymbol *pTVar6;
  Symbol *in_RDI;
  string_view sVar7;
  TransparentMemberSymbol *wrapper_1;
  Symbol *toWrap_1;
  Symbol *member_1;
  iterator __end2_1;
  iterator __begin2_1;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2_1;
  TransparentMemberSymbol *wrapper;
  Symbol *toWrap;
  const_iterator it;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2;
  SymbolMap *scopeNameMap;
  CovergroupType *baseCG;
  Type *ct;
  Symbol *candidateBase;
  string_view baseName;
  Type *baseClass;
  Compilation *comp;
  CovergroupDeclarationSyntax *cds;
  Scope *scope;
  SyntaxNode *syntax;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  CovergroupType *in_stack_fffffffffffffd58;
  ClassType *in_stack_fffffffffffffd60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd68;
  Scope *in_stack_fffffffffffffd70;
  basic_string_view<char,_std::char_traits<char>_> *__x;
  Token *in_stack_fffffffffffffd80;
  Diagnostic *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined6 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  Symbol *in_stack_fffffffffffffdb8;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  in_stack_fffffffffffffdc0;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_1e0;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_1d0;
  Scope *local_1c8;
  ArgList local_1c0;
  CovergroupType *local_1b0;
  size_t local_1a8;
  char *local_1a0;
  Scope *local_198;
  SourceLocation local_190;
  SourceRange local_188;
  undefined4 local_174;
  Type *local_170;
  SourceLocation SVar8;
  SourceLocation local_148;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  string_view *local_d0;
  Scope *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_b0;
  string_view *local_98;
  Scope *local_90;
  iterator local_88;
  size_t local_78;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  Scope *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  Scope *local_8;
  
  this_00 = Symbol::getSyntax(in_RDI);
  pSVar2 = Symbol::getParentScope(in_RDI);
  slang::syntax::SyntaxNode::as<slang::syntax::CovergroupDeclarationSyntax>(this_00);
  bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x4380e3);
  if (bVar1) {
    this_01 = Scope::getCompilation(pSVar2);
    pTVar3 = Compilation::getErrorType(this_01);
    in_RDI[2].nextInScope = &pTVar3->super_Symbol;
    Scope::asSymbol(pSVar2);
    Symbol::as<slang::ast::ClassType>((Symbol *)0x438132);
    pTVar3 = ClassType::getBaseClass(in_stack_fffffffffffffd60);
    if ((pTVar3 != (Type *)0x0) && ((pTVar3->super_Symbol).kind == ClassType)) {
      sVar7 = parsing::Token::valueText((Token *)in_stack_fffffffffffffd70);
      Symbol::as<slang::ast::ClassType>((Symbol *)0x43818d);
      local_148 = (SourceLocation)sVar7._M_str;
      pSVar2 = (Scope *)sVar7._M_len;
      SVar8 = local_148;
      SVar4 = (SourceLocation)
              Scope::find((Scope *)in_stack_fffffffffffffdb8,(string_view)in_stack_fffffffffffffdc0)
      ;
      if ((SVar4 != (SourceLocation)0x0) && (*(int *)SVar4 == 0x3f)) {
        Symbol::as<slang::ast::ClassPropertySymbol>((Symbol *)0x4381f6);
        local_170 = ValueSymbol::getType((ValueSymbol *)0x4381fe);
        if ((local_170->super_Symbol).kind == CovergroupType) {
          in_RDI[2].nextInScope = &local_170->super_Symbol;
        }
      }
      bVar1 = Type::isError((Type *)0x43823a);
      if (bVar1) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xfffffffffffffeb0);
        if (!bVar1) {
          local_174 = 0xcd0006;
          local_188 = parsing::Token::range(in_stack_fffffffffffffd80);
          sourceRange.endLoc = SVar4;
          sourceRange.startLoc = SVar8;
          Scope::addDiag(pSVar2,sVar7._M_len._4_4_,sourceRange);
          local_190 = local_148;
          arg._M_str._0_6_ = in_stack_fffffffffffffdb0;
          arg._M_len = in_stack_fffffffffffffda8;
          arg._M_str._6_1_ = in_stack_fffffffffffffdb6;
          arg._M_str._7_1_ = in_stack_fffffffffffffdb7;
          local_198 = (Scope *)sVar7._M_len;
          Diagnostic::operator<<(in_stack_fffffffffffffda0,arg);
          local_1a8 = (pTVar3->super_Symbol).name._M_len;
          local_1a0 = (pTVar3->super_Symbol).name._M_str;
          sVar7._M_str._0_6_ = in_stack_fffffffffffffdb0;
          sVar7._M_len = in_stack_fffffffffffffda8;
          sVar7._M_str._6_1_ = in_stack_fffffffffffffdb6;
          sVar7._M_str._7_1_ = in_stack_fffffffffffffdb7;
          Diagnostic::operator<<(in_stack_fffffffffffffda0,sVar7);
        }
      }
      else {
        local_1b0 = Symbol::as<slang::ast::CovergroupType>((Symbol *)0x43833a);
        local_1c0 = getArguments(in_stack_fffffffffffffd58);
        in_RDI[2].name._M_len = (size_t)local_1c0._M_ptr;
        in_RDI[2].name._M_str = (char *)local_1c0._M_extent._M_extent_value;
        in_RDI[2].location =
             (SourceLocation)
             (local_1b0->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
             _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload;
        in_RDI[2].parentScope =
             *(Scope **)
              &(local_1b0->event).
               super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
               super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged;
        local_1c8 = (Scope *)Scope::getUnelaboratedNameMap((Scope *)(*(long *)(in_RDI + 2) + 0x40));
        getBody((CovergroupType *)in_stack_fffffffffffffd60);
        local_1e0 = Scope::members(in_stack_fffffffffffffd70);
        local_1d0 = &local_1e0;
        std::ranges::
        subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
        ::begin(local_1d0);
        std::ranges::
        subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
        ::end(local_1d0);
        while (bVar1 = operator==<slang::ast::Scope::iterator>
                                 ((self_type *)in_stack_fffffffffffffd60,
                                  (iterator *)in_stack_fffffffffffffd58), ((bVar1 ^ 0xffU) & 1) != 0
              ) {
          pSVar5 = iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                             ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x438451);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&pSVar5->name);
          if (!bVar1) {
            local_d0 = &pSVar5->name;
            local_c8 = local_1c8;
            local_90 = local_1c8;
            local_68 = local_1c8;
            in_stack_fffffffffffffd70 = local_1c8;
            local_98 = local_d0;
            local_70 = local_d0;
            local_78 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                       ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                 ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                   *)in_stack_fffffffffffffd60,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  in_stack_fffffffffffffd58);
            __x = local_70;
            local_18 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                       *)in_stack_fffffffffffffd60,(size_t)in_stack_fffffffffffffd58
                                     );
            local_20 = local_78;
            pSVar2 = in_stack_fffffffffffffd70;
            local_10 = __x;
            local_8 = in_stack_fffffffffffffd70;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_30,local_18);
            do {
              local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
              local_40 = boost::unordered::detail::foa::
                         table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                         ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                   *)0x4385b0);
              local_40 = local_40 + local_38;
              local_44 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::match
                                   ((group15<boost::unordered::detail::foa::plain_integral> *)
                                    in_stack_fffffffffffffd68,(size_t)in_stack_fffffffffffffd60);
              if (local_44 != 0) {
                local_50 = boost::unordered::detail::foa::
                           table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                       *)0x4385fb);
                local_58 = local_50 + local_38 * 0xf;
                do {
                  local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  in_stack_fffffffffffffd60 =
                       (ClassType *)
                       boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                               *)0x43864b);
                  in_stack_fffffffffffffd68 = local_10;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  ::
                  key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                              *)0x438678);
                  bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                      *)pSVar2,__x,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_fffffffffffffd70);
                  if (bVar1) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                    ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                    goto LAB_0043876c;
                  }
                  local_44 = local_44 - 1 & local_44;
                } while (local_44 != 0);
              }
              bVar1 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffffd60,(size_t)in_stack_fffffffffffffd58);
              if (bVar1) {
                memset(&local_b0,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
                ::table_locator(&local_b0);
                goto LAB_0043876c;
              }
              bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_30,(size_t)pSVar2->thisSym);
            } while (bVar1);
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
            ::table_locator(&local_b0);
LAB_0043876c:
            local_88 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       ::make_iterator((locator *)0x438779);
            local_e0.pc_ = local_88.pc_;
            local_e0.p_ = local_88.p_;
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
            ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
            boost::unordered::
            unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
            ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   *)0x43880b);
            bVar1 = boost::unordered::detail::foa::operator!=
                              ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                *)in_stack_fffffffffffffd60,
                               (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                *)in_stack_fffffffffffffd58);
            if (!bVar1) {
              if (pSVar5->kind == TransparentMember) {
                Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)0x438865);
              }
              BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                        ((BumpAllocator *)in_stack_fffffffffffffd60,
                         (Symbol *)in_stack_fffffffffffffd58);
              Scope::insertMember((Scope *)in_stack_fffffffffffffdc0._M_end.current.current,
                                  in_stack_fffffffffffffdc0._M_begin.current.current,
                                  in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7,
                                  (bool)in_stack_fffffffffffffdb6);
            }
          }
          iterator_facade<slang::ast::Scope::iterator,_false>::
          operator++<slang::ast::Scope::iterator>
                    ((iterator_facade<slang::ast::Scope::iterator,_false> *)
                     in_stack_fffffffffffffd60);
        }
        Scope::members(in_stack_fffffffffffffd70);
        std::ranges::
        subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
        ::begin((subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                 *)&stack0xfffffffffffffdc0);
        std::ranges::
        subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
        ::end((subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
               *)&stack0xfffffffffffffdc0);
        while (bVar1 = operator==<slang::ast::Scope::iterator>
                                 ((self_type *)in_stack_fffffffffffffd60,
                                  (iterator *)in_stack_fffffffffffffd58), ((bVar1 ^ 0xffU) & 1) != 0
              ) {
          pSVar5 = iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                             ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x43893a);
          if (pSVar5->kind == TransparentMember) {
            pTVar6 = Symbol::as<slang::ast::TransparentMemberSymbol>((Symbol *)0x43895d);
            pSVar5 = pTVar6->wrapped;
          }
          if (pSVar5->kind == FormalArgument) {
            BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                      ((BumpAllocator *)in_stack_fffffffffffffd60,
                       (Symbol *)in_stack_fffffffffffffd58);
            function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                      ((function_ref<void_(const_slang::ast::Symbol_&)> *)in_stack_fffffffffffffd60,
                       (Symbol *)in_stack_fffffffffffffd58);
          }
          iterator_facade<slang::ast::Scope::iterator,_false>::
          operator++<slang::ast::Scope::iterator>
                    ((iterator_facade<slang::ast::Scope::iterator,_false> *)
                     in_stack_fffffffffffffd60);
        }
      }
    }
  }
  return;
}

Assistant:

void CovergroupType::inheritMembers(function_ref<void(const Symbol&)> insertCB) const {
    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);

    // If this covergroup doesn't inherit from anything then there's nothing to do.
    auto& cds = syntax->as<CovergroupDeclarationSyntax>();
    if (!cds.extends)
        return;

    auto& comp = scope->getCompilation();
    baseGroup = &comp.getErrorType();

    // Find the base class's group from which we are inheriting.
    auto baseClass = scope->asSymbol().as<ClassType>().getBaseClass();
    if (!baseClass || baseClass->kind != SymbolKind::ClassType)
        return;

    auto baseName = cds.name.valueText();
    auto candidateBase = baseClass->as<ClassType>().find(baseName);
    if (candidateBase && candidateBase->kind == SymbolKind::ClassProperty) {
        auto& ct = candidateBase->as<ClassPropertySymbol>().getType();
        if (ct.kind == SymbolKind::CovergroupType)
            baseGroup = &ct;
    }

    if (baseGroup->isError()) {
        if (!baseName.empty()) {
            scope->addDiag(diag::UnknownCovergroupBase, cds.name.range())
                << baseName << baseClass->name;
        }
        return;
    }

    auto& baseCG = baseGroup->as<CovergroupType>();
    arguments = baseCG.getArguments();
    event = baseCG.event;

    // We have the base group -- inherit all of the members from it.
    auto& scopeNameMap = body.getUnelaboratedNameMap();
    for (auto& member : baseCG.getBody().members()) {
        if (member.name.empty())
            continue;

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        body.insertMember(wrapper, body.lastBuiltinMember, true, false);
    }

    // Also inherit any argument symbols are in the base covergroup type itself,
    // as opposed to the body which we already looked at above.
    for (auto& member : baseCG.members()) {
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        if (toWrap->kind == SymbolKind::FormalArgument) {
            auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
            insertCB(*wrapper);
        }
    }
}